

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::Desugarer::makeArrayComprehension(Desugarer *this,ArrayComprehension *ast)

{
  initializer_list<jsonnet::internal::ArgParam> __l;
  initializer_list<jsonnet::internal::ArgParam> __l_00;
  initializer_list<jsonnet::internal::ArgParam> __l_01;
  initializer_list<jsonnet::internal::Local::Bind> __l_02;
  initializer_list<jsonnet::internal::ArgParam> __l_03;
  char32_t cVar1;
  size_type sVar2;
  Identifier *pIVar3;
  sockaddr *psVar4;
  reference ppIVar5;
  reference pvVar6;
  Apply *pAVar7;
  Function *pFVar8;
  long in_RSI;
  int in_EDI;
  int prev_for;
  AST *out;
  ComprehensionSpec *spec;
  int i_2;
  AST *in;
  int last_for;
  UStringStream ss_1;
  int i_1;
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  _aux;
  UStringStream ss;
  int i;
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  _i;
  Identifier *_l;
  Identifier *_r;
  AST *one;
  AST *zero;
  int n;
  UString *in_stack_fffffffffffff418;
  undefined1 *puVar9;
  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> *args_2;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffff420;
  undefined1 *puVar10;
  Desugarer *pDVar11;
  LocationRange *in_stack_fffffffffffff428;
  undefined1 *loc;
  LocationRange *args;
  Desugarer *in_stack_fffffffffffff430;
  AST *in_stack_fffffffffffff438;
  undefined1 *in_stack_fffffffffffff440;
  LocationRange *in_stack_fffffffffffff448;
  ArgParam *in_stack_fffffffffffff450;
  iterator in_stack_fffffffffffff458;
  LocationRange *in_stack_fffffffffffff460;
  AST *in_stack_fffffffffffff468;
  AST *in_stack_fffffffffffff470;
  LocationRange *in_stack_fffffffffffff478;
  Desugarer *in_stack_fffffffffffff480;
  bool *in_stack_fffffffffffff488;
  Var **in_stack_fffffffffffff490;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffff498;
  void **in_stack_fffffffffffff4a0;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffff4a8;
  void **in_stack_fffffffffffff4b0;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffff4b8;
  AST *in_stack_fffffffffffff4d0;
  Desugarer *in_stack_fffffffffffff4d8;
  size_type *local_b20;
  Allocator *local_b08;
  FodderElement **local_af0;
  AST *in_stack_fffffffffffff548;
  Array *in_stack_fffffffffffff550;
  Array *in_stack_fffffffffffff558;
  undefined8 in_stack_fffffffffffff5f8;
  UStringStream *in_stack_fffffffffffff600;
  _List_node_base *local_958;
  undefined8 ****local_8e0;
  undefined1 local_7d8 [11];
  undefined1 local_7cd;
  undefined1 local_7cc [20];
  pointer local_7b8;
  FodderElement *local_7a8;
  FodderElement local_7a0 [2];
  FodderElement aFStack_748 [2];
  FodderElement *local_6f0;
  undefined8 local_6e8;
  Var *local_6c8;
  Apply *local_6c0;
  Apply *local_690;
  Conditional *local_688;
  undefined1 local_679;
  undefined1 local_678 [64];
  Local *local_638;
  Identifier local_630;
  Desugarer local_610;
  Identifier *local_600;
  Identifier local_5f8 [2];
  Identifier *local_5a0 [11];
  Identifier *local_548;
  undefined8 local_540;
  Allocator *local_520;
  Allocator local_518 [2];
  Desugarer local_468 [11];
  Allocator *local_3b8;
  _Rb_tree_node_base local_3b0;
  undefined1 local_38f [3];
  undefined4 local_38c;
  Var *local_388;
  _List_node_base *local_380;
  _List_node_base local_378 [5];
  _List_node_base local_320 [5];
  _List_node_base local_2c8 [2];
  Var *local_2a0;
  char32_t local_294;
  undefined1 local_290 [22];
  undefined1 local_27a [34];
  Var *local_258;
  undefined1 ****local_250;
  undefined8 ***local_248 [11];
  undefined1 local_1f0 [88];
  undefined1 ****local_198;
  undefined8 local_190;
  Var *local_170;
  Apply *local_168;
  char32_t local_15c;
  char32_t local_118;
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  local_110 [3];
  char32_t local_b8;
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  local_b0 [2];
  sockaddr *local_70;
  Identifier *local_30;
  Identifier local_28;
  
  local_28.name.field_2._8_8_ = in_RSI;
  sVar2 = ::std::
          vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
          ::size((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                  *)(in_RSI + 0xa8));
  local_28.name.field_2._M_local_buf[1] = (char32_t)sVar2;
  local_28.name._M_string_length =
       (size_type)
       make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,char_const(&)[4]>
                 (in_stack_fffffffffffff430,in_stack_fffffffffffff428,
                  (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)in_stack_fffffffffffff420,(char (*) [4])in_stack_fffffffffffff418);
  local_28.name._M_dataplus._M_p =
       (pointer)make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,char_const(&)[4]>
                          (in_stack_fffffffffffff430,in_stack_fffffffffffff428,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)in_stack_fffffffffffff420,(char (*) [4])in_stack_fffffffffffff418);
  ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x21476d);
  ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff460,(char32_t *)in_stack_fffffffffffff458,
             (allocator<char32_t> *)in_stack_fffffffffffff450);
  pIVar3 = id((Desugarer *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  ::std::__cxx11::u32string::~u32string(in_stack_fffffffffffff420);
  ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2147c4);
  local_30 = pIVar3;
  ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2147e9);
  ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff460,(char32_t *)in_stack_fffffffffffff458,
             (allocator<char32_t> *)in_stack_fffffffffffff450);
  psVar4 = (sockaddr *)id((Desugarer *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  ::std::__cxx11::u32string::~u32string(in_stack_fffffffffffff420);
  ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x214840);
  local_70 = psVar4;
  ::std::allocator<const_jsonnet::internal::Identifier_*>::allocator
            ((allocator<const_jsonnet::internal::Identifier_*> *)0x214875);
  ::std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::vector((vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)in_stack_fffffffffffff440,(size_type)in_stack_fffffffffffff438,
           (allocator_type *)in_stack_fffffffffffff430);
  ::std::allocator<const_jsonnet::internal::Identifier_*>::~allocator
            ((allocator<const_jsonnet::internal::Identifier_*> *)0x2148a1);
  for (local_b8 = L'\0'; local_b8 < local_28.name.field_2._M_local_buf[1];
      local_b8 = local_b8 + L'\x01') {
    UStringStream::UStringStream((UStringStream *)0x2148d5);
    UStringStream::operator<<
              ((UStringStream *)in_stack_fffffffffffff420,(char32_t *)in_stack_fffffffffffff418);
    UStringStream::operator<<
              (in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20));
    UStringStream::str_abi_cxx11_((UStringStream *)in_stack_fffffffffffff418);
    pIVar3 = id((Desugarer *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
    ppIVar5 = ::std::
              vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              ::operator[](local_b0,(long)local_b8);
    *ppIVar5 = pIVar3;
    ::std::__cxx11::u32string::~u32string(in_stack_fffffffffffff420);
    UStringStream::~UStringStream((UStringStream *)0x214979);
  }
  ::std::allocator<const_jsonnet::internal::Identifier_*>::allocator
            ((allocator<const_jsonnet::internal::Identifier_*> *)0x214ab5);
  ::std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::vector((vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)in_stack_fffffffffffff440,(size_type)in_stack_fffffffffffff438,
           (allocator_type *)in_stack_fffffffffffff430);
  ::std::allocator<const_jsonnet::internal::Identifier_*>::~allocator
            ((allocator<const_jsonnet::internal::Identifier_*> *)0x214ae1);
  for (local_118 = L'\0'; local_118 < local_28.name.field_2._M_local_buf[1];
      local_118 = local_118 + L'\x01') {
    UStringStream::UStringStream((UStringStream *)0x214b15);
    UStringStream::operator<<
              ((UStringStream *)in_stack_fffffffffffff420,(char32_t *)in_stack_fffffffffffff418);
    UStringStream::operator<<
              (in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20));
    UStringStream::str_abi_cxx11_((UStringStream *)in_stack_fffffffffffff418);
    pIVar3 = id((Desugarer *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
    ppIVar5 = ::std::
              vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              ::operator[](local_110,(long)local_118);
    *ppIVar5 = pIVar3;
    ::std::__cxx11::u32string::~u32string(in_stack_fffffffffffff420);
    UStringStream::~UStringStream((UStringStream *)0x214bb9);
  }
  pvVar6 = ::std::
           vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           ::operator[]((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                         *)(local_28.name.field_2._8_8_ + 0xa8),0);
  local_15c = local_28.name.field_2._M_local_buf[1];
  if (pvVar6->kind != FOR) {
    __assert_fail("ast->specs[0].kind == ComprehensionSpec::FOR",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/desugarer.cpp"
                  ,0x1b4,
                  "AST *jsonnet::internal::Desugarer::makeArrayComprehension(ArrayComprehension *)")
    ;
  }
  do {
    local_15c = local_15c + L'\xffffffff';
    pvVar6 = ::std::
             vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
             ::operator[]((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                           *)(local_28.name.field_2._8_8_ + 0xa8),(long)local_15c);
  } while (pvVar6->kind != FOR);
  ::std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::operator[](local_110,(long)local_15c);
  local_170 = var((Desugarer *)in_stack_fffffffffffff420,(Identifier *)in_stack_fffffffffffff418);
  local_250 = (undefined1 ****)local_248;
  ::std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::operator[](local_b0,(long)local_15c);
  local_258 = var((Desugarer *)in_stack_fffffffffffff420,(Identifier *)in_stack_fffffffffffff418);
  local_27a._30_4_ = 3;
  pIVar3 = &local_28;
  make<jsonnet::internal::Binary,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::AST*&>
            ((Desugarer *)in_stack_fffffffffffff440,(LocationRange *)in_stack_fffffffffffff438,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_fffffffffffff430,(Var **)in_stack_fffffffffffff428,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_fffffffffffff420,(BinaryOp *)pIVar3,(AST **)in_stack_fffffffffffff450);
  ArgParam::ArgParam((ArgParam *)in_stack_fffffffffffff440,in_stack_fffffffffffff438,
                     (Fodder *)in_stack_fffffffffffff430);
  local_250 = (undefined1 ****)local_1f0;
  local_27a._18_8_ = var((Desugarer *)in_stack_fffffffffffff420,pIVar3);
  local_27a._14_4_ = 3;
  local_27a._2_8_ = singleton(in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
  make<jsonnet::internal::Binary,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::Array*>
            ((Desugarer *)in_stack_fffffffffffff440,(LocationRange *)in_stack_fffffffffffff438,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_fffffffffffff430,(Var **)in_stack_fffffffffffff428,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_fffffffffffff420,(BinaryOp *)(local_27a + 2),
             (Array **)in_stack_fffffffffffff450);
  ArgParam::ArgParam((ArgParam *)in_stack_fffffffffffff440,in_stack_fffffffffffff438,
                     (Fodder *)in_stack_fffffffffffff430);
  local_198 = (undefined1 ****)local_248;
  local_190 = 2;
  ::std::allocator<jsonnet::internal::ArgParam>::allocator
            ((allocator<jsonnet::internal::ArgParam> *)0x214ef6);
  __l._M_len = (size_type)in_stack_fffffffffffff460;
  __l._M_array = (iterator)in_stack_fffffffffffff458;
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             in_stack_fffffffffffff450,__l,(allocator_type *)in_stack_fffffffffffff448);
  local_27a[0] = 0;
  local_290[0x15] = 1;
  pDVar11 = (Desugarer *)(local_290 + 0x15);
  loc = EF;
  puVar10 = EF;
  puVar9 = local_27a;
  pAVar7 = make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                     ((Desugarer *)in_stack_fffffffffffff458,
                      (LocationRange *)in_stack_fffffffffffff450,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffff448,(Var **)in_stack_fffffffffffff440,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffff438,
                      (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                       *)pDVar11,(bool *)in_stack_fffffffffffff470,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffff478,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffff480,in_stack_fffffffffffff488);
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::~vector
            ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             pDVar11);
  ::std::allocator<jsonnet::internal::ArgParam>::~allocator
            ((allocator<jsonnet::internal::ArgParam> *)0x214fa2);
  local_8e0 = &local_198;
  do {
    local_8e0 = local_8e0 + -0xb;
    ArgParam::~ArgParam((ArgParam *)puVar10);
    local_168 = pAVar7;
    local_290._16_4_ = local_28.name.field_2._M_local_buf[1];
  } while (local_8e0 != local_248);
  while (local_290._16_4_ = local_290._16_4_ + L'\xffffffff', L'\xffffffff' < (int)local_290._16_4_)
  {
    local_290._8_8_ =
         ::std::
         vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
         ::operator[]((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                       *)(local_28.name.field_2._8_8_ + 0xa8),(long)(int)local_290._16_4_);
    cVar1 = local_290._16_4_;
    if ((int)local_290._16_4_ < L'\x01') {
      local_290._0_8_ = var((Desugarer *)puVar10,(Identifier *)puVar9);
    }
    else {
      do {
        local_294 = cVar1 + L'\xffffffff';
        pvVar6 = ::std::
                 vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                 ::operator[]((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                               *)(local_28.name.field_2._8_8_ + 0xa8),(long)local_294);
        cVar1 = local_294;
      } while (pvVar6->kind != FOR);
      ::std::
      vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::operator[](local_110,(long)local_294);
      local_2a0 = var((Desugarer *)puVar10,(Identifier *)puVar9);
      local_380 = local_378;
      ::std::
      vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::operator[](local_b0,(long)local_294);
      local_388 = var((Desugarer *)puVar10,(Identifier *)puVar9);
      local_38c = 3;
      pIVar3 = &local_28;
      make<jsonnet::internal::Binary,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::AST*&>
                ((Desugarer *)in_stack_fffffffffffff440,(LocationRange *)in_stack_fffffffffffff438,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)pDVar11,(Var **)loc,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)puVar10,(BinaryOp *)pIVar3,(AST **)in_stack_fffffffffffff450);
      ArgParam::ArgParam((ArgParam *)in_stack_fffffffffffff440,in_stack_fffffffffffff438,
                         (Fodder *)pDVar11);
      local_380 = local_320;
      var((Desugarer *)puVar10,pIVar3);
      ArgParam::ArgParam((ArgParam *)in_stack_fffffffffffff440,in_stack_fffffffffffff438,
                         (Fodder *)pDVar11);
      local_2c8[0]._M_next = local_378;
      local_2c8[0]._M_prev = (_List_node_base *)0x2;
      ::std::allocator<jsonnet::internal::ArgParam>::allocator
                ((allocator<jsonnet::internal::ArgParam> *)0x215345);
      __l_00._M_len = (size_type)in_stack_fffffffffffff460;
      __l_00._M_array = (iterator)in_stack_fffffffffffff458;
      ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             in_stack_fffffffffffff450,__l_00,(allocator_type *)in_stack_fffffffffffff448);
      local_38f[1] = 0;
      local_38f[0] = 1;
      pDVar11 = (Desugarer *)local_38f;
      loc = EF;
      puVar10 = EF;
      puVar9 = local_38f + 1;
      local_290._0_8_ =
           make<jsonnet::internal::Apply,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                     ((Desugarer *)in_stack_fffffffffffff458,
                      (LocationRange *)in_stack_fffffffffffff450,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffff448,(Var **)in_stack_fffffffffffff440,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffff438,
                      (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                       *)pDVar11,(bool *)in_stack_fffffffffffff470,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffff478,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffff480,in_stack_fffffffffffff488);
      ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
              pDVar11);
      ::std::allocator<jsonnet::internal::ArgParam>::~allocator
                ((allocator<jsonnet::internal::ArgParam> *)0x215400);
      local_958 = local_2c8;
      do {
        local_958 = (_List_node_base *)&local_958[-6]._M_prev;
        ArgParam::~ArgParam((ArgParam *)puVar10);
      } while (local_958 != local_378);
    }
    if (*(Kind *)local_290._8_8_ == FOR) {
      local_679 = 1;
      local_520 = local_518;
      bind((Desugarer *)local_520,in_EDI,local_70,(socklen_t)*(AST **)(local_290._8_8_ + 0x58));
      local_520 = (Allocator *)local_468;
      ppIVar5 = ::std::
                vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                ::operator[](local_110,(long)(int)local_290._16_4_);
      psVar4 = (sockaddr *)*ppIVar5;
      local_600 = local_5f8;
      ::std::
      vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::operator[](local_b0,(long)(int)local_290._16_4_);
      ArgParam::ArgParam(in_stack_fffffffffffff450,(Fodder *)in_stack_fffffffffffff448,
                         (Identifier *)in_stack_fffffffffffff440,(Fodder *)in_stack_fffffffffffff438
                        );
      local_600 = (Identifier *)local_5a0;
      ArgParam::ArgParam(in_stack_fffffffffffff450,(Fodder *)in_stack_fffffffffffff448,
                         (Identifier *)in_stack_fffffffffffff440,(Fodder *)in_stack_fffffffffffff438
                        );
      local_548 = local_5f8;
      local_540 = 2;
      ::std::allocator<jsonnet::internal::ArgParam>::allocator
                ((allocator<jsonnet::internal::ArgParam> *)0x215760);
      __l_01._M_len = (size_type)in_stack_fffffffffffff460;
      __l_01._M_array = (iterator)in_stack_fffffffffffff458;
      ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             in_stack_fffffffffffff450,__l_01,(allocator_type *)in_stack_fffffffffffff448);
      local_610._14_1_ = 0;
      ::std::
      vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::operator[](local_b0,(long)(int)local_290._16_4_);
      local_630.name.field_2._M_allocated_capacity =
           (size_type)var((Desugarer *)puVar10,(Identifier *)puVar9);
      local_630.name._M_string_length._4_4_ = 8;
      var((Desugarer *)puVar10,(Identifier *)puVar9);
      local_630.name._M_dataplus._M_p =
           (pointer)length((Desugarer *)in_stack_fffffffffffff470,in_stack_fffffffffffff468);
      pIVar3 = &local_630;
      local_630.name.field_2._8_8_ =
           make<jsonnet::internal::Binary,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::Apply*>
                     ((Desugarer *)in_stack_fffffffffffff440,
                      (LocationRange *)in_stack_fffffffffffff438,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)pDVar11,(Var **)loc,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)puVar10,(BinaryOp *)pIVar3,(Apply **)in_stack_fffffffffffff450);
      local_678._32_8_ = var((Desugarer *)puVar10,pIVar3);
      local_678[0x1f] = '\0';
      ::std::
      vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::operator[](local_b0,(long)(int)local_290._16_4_);
      local_678._16_8_ = var((Desugarer *)puVar10,pIVar3);
      local_678._8_8_ = 0;
      local_678._0_8_ = (_func_int **)0x0;
      in_stack_fffffffffffff440 = EF;
      in_stack_fffffffffffff438 = (AST *)local_678;
      puVar10 = EF;
      args = (LocationRange *)(local_678 + 8);
      puVar9 = EF;
      args_2 = (vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                *)(local_678 + 0x10);
      make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                ((Desugarer *)in_stack_fffffffffffff468,in_stack_fffffffffffff460,
                 &in_stack_fffffffffffff458->varFodder,(Var **)in_stack_fffffffffffff450,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_fffffffffffff448,(bool *)EF,in_stack_fffffffffffff490,
                 in_stack_fffffffffffff498,in_stack_fffffffffffff4a0,in_stack_fffffffffffff4a8,
                 in_stack_fffffffffffff4b0,in_stack_fffffffffffff4b8);
      singleBind((Desugarer *)in_stack_fffffffffffff558,(Identifier *)in_stack_fffffffffffff550,
                 in_stack_fffffffffffff548);
      local_638 = make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::AST*&>
                            ((Desugarer *)puVar10,args,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)puVar9,args_2,(AST **)0x215a04);
      local_610.alloc =
           (Allocator *)
           make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Binary*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Local*>
                     ((Desugarer *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffff440,(Binary **)in_stack_fffffffffffff438,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)puVar10,(AST **)args,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffff460,(Local **)in_stack_fffffffffffff468);
      pDVar11 = &local_610;
      puVar9 = EF;
      pFVar8 = make<jsonnet::internal::Function,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Conditional*>
                         ((Desugarer *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffff440,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffff438,
                          (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                           *)puVar10,(bool *)args,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffff460,(Conditional **)in_stack_fffffffffffff468);
      bind(local_468,in_EDI,psVar4,(socklen_t)pFVar8);
      local_679 = 0;
      local_3b8 = local_518;
      local_3b0._M_color = 2;
      local_3b0._4_4_ = 0;
      ::std::allocator<jsonnet::internal::Local::Bind>::allocator
                ((allocator<jsonnet::internal::Local::Bind> *)0x215b24);
      __l_02._M_len = (size_type)in_stack_fffffffffffff460;
      __l_02._M_array = in_stack_fffffffffffff458;
      ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
      ::vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                *)in_stack_fffffffffffff450,__l_02,(allocator_type *)in_stack_fffffffffffff448);
      var(pDVar11,(Identifier *)puVar9);
      type((Desugarer *)in_stack_fffffffffffff470,in_stack_fffffffffffff468);
      ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x215bba);
      ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 in_stack_fffffffffffff460,(char32_t *)in_stack_fffffffffffff458,
                 (allocator<char32_t> *)in_stack_fffffffffffff450);
      str((Desugarer *)puVar10,(UString *)args);
      local_690 = equals(in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                         in_stack_fffffffffffff470,in_stack_fffffffffffff468);
      ::std::
      vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::operator[](local_110,(long)(int)local_290._16_4_);
      local_6c8 = var(pDVar11,(Identifier *)puVar9);
      local_7cc[1] = 1;
      local_7a8 = local_7a0;
      ArgParam::ArgParam((ArgParam *)in_stack_fffffffffffff440,in_stack_fffffffffffff438,
                         (Fodder *)puVar10);
      local_7a8 = aFStack_748;
      local_7cc[3] = 0;
      if (local_290._16_4_ == L'\0') {
        local_7cc._4_8_ = (pointer)0x0;
        local_7cc._12_8_ = (Identifier *)0x0;
        local_7b8 = (pointer)0x0;
        ::std::
        vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
        ::vector((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                  *)0x215d03);
        local_7cc[3] = 1;
        local_7cc[2] = 0;
        in_stack_fffffffffffff558 =
             make<jsonnet::internal::Array,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                       ((Desugarer *)in_stack_fffffffffffff440,
                        (LocationRange *)in_stack_fffffffffffff438,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)puVar10,
                        (vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                         *)args,(bool *)pDVar11,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)puVar9);
      }
      else {
        in_stack_fffffffffffff550 = (Array *)var(pDVar11,(Identifier *)puVar9);
        in_stack_fffffffffffff558 = in_stack_fffffffffffff550;
      }
      ArgParam::ArgParam((ArgParam *)in_stack_fffffffffffff440,in_stack_fffffffffffff438,
                         (Fodder *)puVar10);
      local_7cc[1] = 0;
      local_6f0 = local_7a0;
      local_6e8 = 2;
      in_stack_fffffffffffff548 = (AST *)local_7cc;
      ::std::allocator<jsonnet::internal::ArgParam>::allocator
                ((allocator<jsonnet::internal::ArgParam> *)0x215de5);
      __l_03._M_len = (size_type)in_stack_fffffffffffff460;
      __l_03._M_array = (iterator)in_stack_fffffffffffff458;
      ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             in_stack_fffffffffffff450,__l_03,(allocator_type *)in_stack_fffffffffffff448);
      local_7cd = 0;
      local_7d8[10] = 1;
      pDVar11 = (Desugarer *)(local_7d8 + 10);
      loc = EF;
      puVar9 = EF;
      local_6c0 = make<jsonnet::internal::Apply,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                            ((Desugarer *)in_stack_fffffffffffff458,
                             (LocationRange *)in_stack_fffffffffffff450,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)in_stack_fffffffffffff448,(Var **)in_stack_fffffffffffff440,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)in_stack_fffffffffffff438,
                             (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                              *)pDVar11,(bool *)in_stack_fffffffffffff470,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)in_stack_fffffffffffff478,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)in_stack_fffffffffffff480,in_stack_fffffffffffff488);
      ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x215eaf);
      ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 in_stack_fffffffffffff460,(char32_t *)in_stack_fffffffffffff458,
                 (allocator<char32_t> *)in_stack_fffffffffffff450);
      local_7d8._0_8_ = error(pDVar11,(LocationRange *)loc,(UString *)puVar9);
      puVar10 = local_7d8;
      puVar9 = EF;
      local_688 = make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Apply*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Apply*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Error*>
                            ((Desugarer *)in_stack_fffffffffffff450,in_stack_fffffffffffff448,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)in_stack_fffffffffffff440,(Apply **)in_stack_fffffffffffff438,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)pDVar11,(Apply **)loc,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)in_stack_fffffffffffff460,(Error **)in_stack_fffffffffffff468);
      local_168 = (Apply *)make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::Conditional*>
                                     (pDVar11,(LocationRange *)loc,
                                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                       *)puVar10,
                                      (vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                                       *)puVar9,(Conditional **)0x215f8b);
      ::std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 puVar10);
      ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x215fbf);
      ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
              pDVar11);
      ::std::allocator<jsonnet::internal::ArgParam>::~allocator
                ((allocator<jsonnet::internal::ArgParam> *)0x215fd9);
      local_af0 = &local_6f0;
      do {
        local_af0 = local_af0 + 0xfffffffffffffff5;
        ArgParam::~ArgParam((ArgParam *)puVar10);
      } while ((FodderElement *)local_af0 != local_7a0);
      if ((local_7cc[3] & 1) != 0) {
        ::std::
        vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
        ::~vector((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                   *)pDVar11);
      }
      ::std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 puVar10);
      ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x216060);
      ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
      ::~vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                 *)pDVar11);
      ::std::allocator<jsonnet::internal::Local::Bind>::~allocator
                ((allocator<jsonnet::internal::Local::Bind> *)0x21607a);
      local_b08 = (Allocator *)&local_3b8;
      do {
        local_b08 = (Allocator *)
                    &local_b08[-3].internedIdentifiers._M_t._M_impl.super__Rb_tree_header.
                     _M_node_count;
        Local::Bind::~Bind((Bind *)puVar10);
      } while (local_b08 != local_518);
      ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
      ::~vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                 *)pDVar11);
      ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
              pDVar11);
      ::std::allocator<jsonnet::internal::ArgParam>::~allocator
                ((allocator<jsonnet::internal::ArgParam> *)0x2160f8);
      pIVar3 = local_5f8;
      local_b20 = (size_type *)&local_548;
      do {
        local_b20 = local_b20 + -0xb;
        ArgParam::~ArgParam((ArgParam *)puVar10);
      } while ((Identifier *)local_b20 != pIVar3);
    }
    else if (*(Kind *)local_290._8_8_ == IF) {
      puVar10 = local_290;
      puVar9 = EF;
      local_168 = (Apply *)make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&>
                                     ((Desugarer *)in_stack_fffffffffffff450,
                                      in_stack_fffffffffffff448,
                                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                       *)in_stack_fffffffffffff440,(AST **)in_stack_fffffffffffff438
                                      ,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                        *)pDVar11,(AST **)loc,
                                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                       *)in_stack_fffffffffffff460,(AST **)in_stack_fffffffffffff468
                                     );
    }
  }
  pAVar7 = local_168;
  ::std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::~vector((vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
             *)pDVar11);
  ::std::
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::~vector((vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
             *)pDVar11);
  return &pAVar7->super_AST;
}

Assistant:

AST* makeArrayComprehension(ArrayComprehension *ast) {
        int n = ast->specs.size();
        AST *zero = make<LiteralNumber>(E, EF, "0.0");
        AST *one = make<LiteralNumber>(E, EF, "1.0");
        auto *_r = id(U"$r");
        auto *_l = id(U"$l");
        std::vector<const Identifier *> _i(n);
        for (int i = 0; i < n; ++i) {
            UStringStream ss;
            ss << U"$i_" << i;
            _i[i] = id(ss.str());
        }
        std::vector<const Identifier *> _aux(n);
        for (int i = 0; i < n; ++i) {
            UStringStream ss;
            ss << U"$aux_" << i;
            _aux[i] = id(ss.str());
        }

        // Build it from the inside out.  We keep wrapping 'in' with more ASTs.
        assert(ast->specs[0].kind == ComprehensionSpec::FOR);

        int last_for = n - 1;
        while (ast->specs[last_for].kind != ComprehensionSpec::FOR)
            last_for--;
        // $aux_{last_for}($i_{last_for} + 1, $r + [body])
        AST *in = make<Apply>(
            ast->body->location,
            EF,
            var(_aux[last_for]),
            EF,
            ArgParams{{make<Binary>(E, EF, var(_i[last_for]), EF, BOP_PLUS, one), EF},
                {make<Binary>(E, EF, var(_r), EF, BOP_PLUS, singleton(ast->body)), EF}},
            false,  // trailingComma
            EF,
            EF,
            true  // tailstrict
        );
        for (int i = n - 1; i >= 0; --i) {
            const ComprehensionSpec &spec = ast->specs[i];
            AST *out;
            if (i > 0) {
                int prev_for = i - 1;
                while (ast->specs[prev_for].kind != ComprehensionSpec::FOR)
                    prev_for--;

                // aux_{prev_for}($i_{prev_for} + 1, $r)
                out = make<Apply>(  // False branch.
                    E,
                    EF,
                    var(_aux[prev_for]),
                    EF,
                    ArgParams{{
                        make<Binary>(E, EF, var(_i[prev_for]), EF, BOP_PLUS, one),
                            EF,
                            },
                      {
                        var(_r),
                            EF,
                            }},
                    false,  // trailingComma
                    EF,
                    EF,
                    true  // tailstrict
                );
            } else {
                out = var(_r);
            }
            switch (spec.kind) {
                case ComprehensionSpec::IF: {
                  /*
                    if [[[...cond...]]] then
                    [[[...in...]]]
                    else
                    [[[...out...]]]
                  */
                    in = make<Conditional>(ast->location,
                                           EF,
                                           spec.expr,
                                           EF,
                                           in,  // True branch.
                                           EF,
                                           out);  // False branch.
                } break;
                case ComprehensionSpec::FOR: {
                    /*
                      local $l = [[[...array...]]]
                      aux_{i}(i_{i}, r) =
                      if i_{i} >= std.length($l) then
                      [[[...out...]]]
                      else
                      local [[[...var...]]] = $l[i_{i}];
                      [[[...in...]]];
                      if std.type($l) == "array" then
                      aux_{i}(0, $r) tailstrict
                      else
                      error "In comprehension, can only iterate over array..";
                    */
                    in = make<Local>(
                        ast->location,
                        EF,
                        Local::Binds{
                          bind(_l, spec.expr),  // Need to check expr is an array
                              bind(_aux[i],
                                   make<Function>(
                                       ast->location,
                                       EF,
                                       EF,
                                       ArgParams{{EF, _i[i], EF}, {EF, _r, EF}},
                                       false,  // trailingComma
                                       EF,
                                       make<Conditional>(ast->location,
                                                         EF,
                                                         make<Binary>(E,
                                                                      EF,
                                                                      var(_i[i]),
                                                                      EF,
                                                                      BOP_GREATER_EQ,
                                                                      length(var(_l))),
                                                         EF,
                                                         out,
                                                         EF,
                                                         make<Local>(
                                                             ast->location,
                                                             EF,
                                                             singleBind(spec.var,
                                                                        make<Index>(E,
                                                                                    EF,
                                                                                    var(_l),
                                                                                    EF,
                                                                                    false,
                                                                                    var(_i[i]),
                                                                                    EF,
                                                                                    nullptr,
                                                                                    EF,
                                                                                    nullptr,
                                                                                    EF)),
                                                             in))))},
                        make<Conditional>(
                            ast->location,
                            EF,
                            equals(ast->location, type(var(_l)), str(U"array")),
                            EF,
                            make<Apply>(
                                E,
                                EF,
                                var(_aux[i]),
                                EF,
                                ArgParams{{zero, EF},
                                  {
                                    i == 0 ? make<Array>(
                                        E, EF, Array::Elements{}, false, EF)
                                        : static_cast<AST *>(var(_r)),
                                        EF,
                                        }},
                                false,  // trailingComma
                                EF,
                                EF,
                                true),  // tailstrict
                            EF,
                            error(ast->location,
                                  U"In comprehension, can only iterate over array.")));
                } break;
            }
        }

        return in;
    }